

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MinBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_minbroadcastable(NeuralNetworkLayer *this)

{
  bool bVar1;
  MinBroadcastableLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_minbroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_minbroadcastable(this);
    this_00 = (MinBroadcastableLayerParams *)operator_new(0x18);
    MinBroadcastableLayerParams::MinBroadcastableLayerParams(this_00);
    (this->layer_).minbroadcastable_ = this_00;
  }
  return (MinBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MinBroadcastableLayerParams* NeuralNetworkLayer::mutable_minbroadcastable() {
  if (!has_minbroadcastable()) {
    clear_layer();
    set_has_minbroadcastable();
    layer_.minbroadcastable_ = new ::CoreML::Specification::MinBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.minBroadcastable)
  return layer_.minbroadcastable_;
}